

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

FunctionCall * __thiscall
soul::PoolAllocator::
allocate<soul::AST::FunctionCall,soul::AST::Context&,soul::AST::Function&,soul::pool_ptr<soul::AST::CommaSeparatedList>&,bool&>
          (PoolAllocator *this,Context *args,Function *args_1,
          pool_ptr<soul::AST::CommaSeparatedList> *args_2,bool *args_3)

{
  PoolItem *pPVar1;
  pool_ptr<soul::AST::CommaSeparatedList> local_38;
  
  pPVar1 = allocateSpaceForObject(this,0x48);
  local_38 = (pool_ptr<soul::AST::CommaSeparatedList>)args_2->object;
  AST::FunctionCall::FunctionCall((FunctionCall *)&pPVar1->item,args,args_1,&local_38,*args_3);
  pPVar1->destructor =
       allocate<soul::AST::FunctionCall,_soul::AST::Context_&,_soul::AST::Function_&,_soul::pool_ptr<soul::AST::CommaSeparatedList>_&,_bool_&>
       ::anon_class_1_0_00000001::__invoke;
  return (FunctionCall *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }